

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,AccessChainFlags flags,AccessChainMeta *meta)

{
  Variant *pVVar1;
  pointer pcVar2;
  ID id;
  char cVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  uint32_t uVar7;
  StorageClass SVar8;
  SPIRExpression *pSVar9;
  undefined4 extraout_var_00;
  SPIRType *pSVar10;
  long lVar11;
  undefined7 extraout_var;
  string *psVar12;
  undefined8 uVar13;
  SPIRVariable *var;
  SPIRType *pSVar14;
  mapped_type *pmVar15;
  SPIRConstant *pSVar16;
  size_t sVar17;
  runtime_error *prVar18;
  undefined7 uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint32_t extraout_EDX;
  uint32_t uVar20;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  SPIRType *pSVar21;
  bool bVar22;
  uint uVar23;
  uint uVar24;
  CompilerGLSL *pCVar25;
  _Alloc_hider _Var26;
  undefined4 in_register_00000084;
  string *psVar27;
  undefined4 in_register_0000008c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  ulong uVar28;
  bool is_packed;
  string qual_mbr_name;
  BuiltIn builtin;
  bool local_f5;
  uint32_t local_f4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  string local_e8;
  byte local_c1;
  AccessChainFlags local_c0;
  uint local_bc;
  ID local_b8;
  uint local_b4;
  string local_b0;
  uint local_90;
  uint32_t local_8c;
  ulong local_88;
  uint local_80;
  uint local_7c;
  BuiltIn local_78;
  uint local_74;
  ulong local_70;
  string local_68;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_48;
  ulong local_40;
  uint32_t *local_38;
  
  ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_0000008c,flags);
  psVar27 = (string *)CONCAT44(in_register_00000084,count);
  local_f0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_f0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_70 = (ulong)base;
  local_c0 = flags;
  local_b8.id = base;
  local_38 = indices;
  if ((flags & 2) == 0) {
    bVar4 = true;
    if ((local_70 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size
        ) && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar1[local_70].type == TypeExpression)) {
      pSVar9 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + local_70);
      bVar22 = pSVar9->need_transpose;
      pSVar9->need_transpose = false;
      bVar4 = false;
    }
    else {
      bVar22 = false;
      pSVar9 = (SPIRExpression *)0x0;
    }
    to_enclosed_expression_abi_cxx11_(&local_e8,this,local_b8.id,(local_c0 & 8) == 0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (!bVar4) {
      pSVar9->need_transpose = bVar22;
    }
  }
  uVar7 = Compiler::expression_type_id(&this->super_Compiler,local_b8.id);
  local_88 = CONCAT44(extraout_var_00,uVar7);
  if ((this->backend).native_pointers == false) {
    if ((local_c0 & 4) != 0) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,
                 "Backend does not support native pointers and does not support OpPtrAccessChain.",
                 "");
      ::std::runtime_error::runtime_error(prVar18,(string *)&local_e8);
      *(undefined ***)prVar18 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar4 = should_dereference(this,local_b8.id);
    if (bVar4) {
      pSVar10 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (local_88 & 0xffffffff));
      dereference_expression(&local_e8,this,pSVar10,__return_storage_ptr__);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
  }
  pSVar10 = Compiler::get_pointee_type(&this->super_Compiler,(uint32_t)local_88);
  lVar11 = ::std::__cxx11::string::find((char)__return_storage_ptr__,0x5b);
  id.id = local_b8.id;
  local_c1 = lVar11 != -1;
  local_b4 = (*(this->super_Compiler)._vptr_Compiler[0x25])(this,(ulong)local_b8.id);
  local_f5 = Compiler::has_extended_decoration
                       (&this->super_Compiler,id.id,SPIRVCrossDecorationPhysicalTypePacked);
  local_8c = Compiler::get_extended_decoration
                       (&this->super_Compiler,id.id,SPIRVCrossDecorationPhysicalTypeID);
  bVar4 = Compiler::has_decoration(&this->super_Compiler,id,DecorationInvariant);
  local_80 = (uint)CONCAT71(extraout_var,bVar4);
  if (count != 0) {
    local_74 = local_c0 & 0x11;
    pSVar21 = (SPIRType *)&(this->super_Compiler).ir.meta;
    local_7c = local_c0 & 0xfffffffe;
    local_40 = (ulong)count;
    uVar28 = 0;
    local_90 = 0;
    local_bc = 0;
    local_48 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)pSVar21;
    do {
      bVar4 = (local_c0 & 4) == 0;
      pSVar21 = (SPIRType *)CONCAT71((int7)((ulong)pSVar21 >> 8),bVar4);
      uVar24 = local_38[uVar28];
      uVar23 = 0;
      if (-1 < (int)uVar24) {
        uVar23 = local_c0 & 0xff;
      }
      uVar7 = uVar24 & 0x7fffffff;
      if (local_74 != 0x11) {
        uVar7 = uVar24;
        uVar23 = local_c0 & 0xff;
      }
      bVar4 = uVar28 != 0 || bVar4;
      uVar20 = CONCAT31((int3)(uVar24 >> 8),bVar4);
      local_f4 = uVar7;
      if (bVar4) {
        pSVar21 = (SPIRType *)(pSVar10->array).super_VectorView<unsigned_int>.buffer_size;
        if (pSVar21 == (SPIRType *)0x0) {
          if (*(int *)&(pSVar10->super_IVariant).field_0xc == 0xf) {
            if ((uVar23 & 1) == 0) {
              uVar7 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar7);
            }
            local_f4 = uVar7;
            if ((pSVar10->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size <=
                (ulong)uVar7) {
              prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e8,"Member index is out of bounds!","");
              ::std::runtime_error::runtime_error(prVar18,(string *)&local_e8);
              *(undefined ***)prVar18 = &PTR__runtime_error_00357118;
              __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            bVar4 = Compiler::is_member_builtin(&this->super_Compiler,pSVar10,uVar7,&local_78);
            if (bVar4) {
              if ((local_c1 & 1) == 0) {
                (*(this->super_Compiler)._vptr_Compiler[0x14])
                          (&local_e8,this,(ulong)local_78,(ulong)pSVar10->storage);
                ::std::__cxx11::string::operator=
                          ((string *)__return_storage_ptr__,(string *)&local_e8);
              }
              else {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                (*(this->super_Compiler)._vptr_Compiler[0x14])
                          (&local_e8,this,(ulong)local_78,(ulong)pSVar10->storage);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              }
            }
            else {
              psVar12 = Compiler::get_member_qualified_name_abi_cxx11_
                                  (&this->super_Compiler,(TypeID)(uint32_t)local_88,local_f4);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              pcVar2 = (psVar12->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,pcVar2,pcVar2 + psVar12->_M_string_length);
              if (local_e8._M_string_length == 0) {
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ulong)local_c0;
                if ((local_c0 & 0x20) == 0) {
                  ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ulong)((local_c0 & 4) >> 2);
                  psVar27 = (string *)(ulong)local_f4;
                  (*(this->super_Compiler)._vptr_Compiler[0x2a])
                            (&local_b0,this,(ulong)local_b8.id,pSVar10);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
                  psVar12 = &local_b0;
                  _Var26._M_p = local_b0._M_dataplus._M_p;
                }
                else {
                  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ulong)local_f4;
                  to_member_name_abi_cxx11_(&local_68,this,pSVar10,local_f4);
                  join<char_const(&)[2],std::__cxx11::string>
                            (&local_b0,(spirv_cross *)0x2e3de5,(char (*) [2])&local_68,ts_1);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p);
                  }
                  psVar12 = &local_68;
                  _Var26._M_p = local_68._M_dataplus._M_p;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var26._M_p != &psVar12->field_2) {
                  operator_delete(_Var26._M_p);
                }
              }
              else {
                ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            bVar4 = Compiler::has_member_decoration
                              (&this->super_Compiler,(TypeID)(pSVar10->super_IVariant).self.id,
                               local_f4,DecorationInvariant);
            local_80 = local_80 & 0xff;
            if (bVar4) {
              local_80 = 1;
            }
            local_f5 = Compiler::has_extended_member_decoration
                                 (&this->super_Compiler,(pSVar10->super_IVariant).self.id,local_f4,
                                  SPIRVCrossDecorationPhysicalTypePacked);
            bVar4 = Compiler::has_extended_member_decoration
                              (&this->super_Compiler,(pSVar10->super_IVariant).self.id,local_f4,
                               SPIRVCrossDecorationPhysicalTypeID);
            local_8c = 0;
            if (bVar4) {
              local_8c = Compiler::get_extended_member_decoration
                                   (&this->super_Compiler,(pSVar10->super_IVariant).self.id,local_f4
                                    ,SPIRVCrossDecorationPhysicalTypeID);
            }
            local_b4 = (*(this->super_Compiler)._vptr_Compiler[0x26])(this,pSVar10,(ulong)local_f4);
            pSVar21 = (SPIRType *)
                      (pSVar10->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
            pSVar10 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_Compiler).ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)((pSVar21->array).stack_storage.aligned_char +
                                          (ulong)local_f4 * 4 + -0x38));
          }
          else if (pSVar10->columns < 2) {
            if (pSVar10->vecsize < 2) {
              if ((this->backend).allow_truncated_access_chain == false) {
                prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_e8,"Cannot subdivide a scalar value!","");
                ::std::runtime_error::runtime_error(prVar18,(string *)&local_e8);
                *(undefined ***)prVar18 = &PTR__runtime_error_00357118;
                __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
            }
            else {
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              local_e8._M_string_length = 0;
              local_e8.field_2._M_local_buf[0] = '\0';
              if (((local_b4 & 1) != 0) &&
                 (lVar11 = ::std::__cxx11::string::rfind((char)__return_storage_ptr__,0x5b),
                 lVar11 != -1)) {
                ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)__return_storage_ptr__);
                ::std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p);
                }
                ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar11);
              }
              pSVar21 = Compiler::expression_type(&this->super_Compiler,local_b8.id);
              SVar8 = StorageClassGeneric;
              if (pSVar21->pointer == true) {
                SVar8 = Compiler::get_expression_effective_storage_class
                                  (&this->super_Compiler,local_b8.id);
              }
              if ((local_b4 & 1) == 0) {
                pSVar14 = Variant::get<spirv_cross::SPIRType>
                                    ((this->super_Compiler).ir.ids.
                                     super_VectorView<spirv_cross::Variant>.ptr +
                                     (pSVar10->parent_type).id);
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (this->super_Compiler)._vptr_Compiler;
                pSVar21 = (SPIRType *)(ulong)SVar8;
                psVar27 = (string *)&local_f5;
                (*(code *)ts_3[10]._M_string_length)(this,__return_storage_ptr__,pSVar14,pSVar21);
                if (((uVar23 & 1) == 0) || (((local_f5 | (byte)local_b4) & 1) != 0)) {
                  pSVar21 = (SPIRType *)
                            (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                  ;
                  if ((*(int *)((pSVar21->array).stack_storage.aligned_char +
                               (ulong)local_f4 * 0x18 + -0x28) != 3) ||
                     (((local_f5 | (byte)local_b4) & 1) != 0)) goto LAB_001bfbc6;
                  pSVar16 = Variant::get<spirv_cross::SPIRConstant>
                                      ((Variant *)
                                       ((pSVar21->array).stack_storage.aligned_char +
                                       (ulong)local_f4 * 0x18 + -0x38));
                  if (pSVar16->specialization == true) {
                    to_expression_abi_cxx11_(&local_68,this,local_f4,true);
                    pSVar21 = (SPIRType *)0x2e390f;
                    join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                              (&local_b0,(spirv_cross *)0x2f169e,(char (*) [2])&local_68,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x2e390f,(char (*) [2])psVar27);
                    ::std::__cxx11::string::_M_append
                              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_68._M_dataplus._M_p != &local_68.field_2) {
                      operator_delete(local_68._M_dataplus._M_p);
                    }
                  }
                  else {
                    pCVar25 = (CompilerGLSL *)__return_storage_ptr__;
                    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                    index_to_swizzle(pCVar25,(pSVar16->m).c[0].r[0].u32);
                    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                  }
                }
                else {
                  pCVar25 = (CompilerGLSL *)__return_storage_ptr__;
                  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                  index_to_swizzle(pCVar25,local_f4);
                  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                }
              }
              else {
LAB_001bfbc6:
                if ((uVar23 & 1) == 0) {
                  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                  pSVar21 = (SPIRType *)0x0;
                  to_expression_abi_cxx11_(&local_b0,this,local_f4,(local_c0 & 8) == 0);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p);
                  }
                  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                }
                else {
                  pSVar21 = (SPIRType *)0x2e390f;
                  join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                            (&local_b0,(spirv_cross *)0x2f169e,(char (*) [2])&local_f4,
                             (uint *)0x2e390f,(char (*) [2])psVar27);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p);
                  }
                }
                if ((local_b4 & 1) != 0) {
                  pSVar14 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_Compiler).ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       (pSVar10->parent_type).id);
                  ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (this->super_Compiler)._vptr_Compiler;
                  pSVar21 = (SPIRType *)(ulong)SVar8;
                  psVar27 = (string *)&local_f5;
                  (*(code *)ts_3[10]._M_string_length)(this,__return_storage_ptr__,pSVar14,pSVar21);
                }
              }
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              local_f5 = false;
              local_88 = (ulong)(pSVar10->parent_type).id;
              pSVar10 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + local_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              local_8c = 0;
              local_b4 = 0;
            }
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar7 = local_f4;
            if ((uVar23 & 1) == 0) {
              pSVar21 = (SPIRType *)0x0;
              to_expression_abi_cxx11_(&local_e8,this,local_f4,(local_c0 & 8) == 0);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
            }
            else {
              cVar6 = '\x01';
              if (9 < local_f4) {
                pSVar21 = (SPIRType *)(ulong)local_f4;
                cVar3 = '\x04';
                do {
                  cVar6 = cVar3;
                  uVar24 = (uint)pSVar21;
                  if (uVar24 < 100) {
                    cVar6 = cVar6 + -2;
                    goto LAB_001c059e;
                  }
                  if (uVar24 < 1000) {
                    cVar6 = cVar6 + -1;
                    goto LAB_001c059e;
                  }
                  if (uVar24 < 10000) goto LAB_001c059e;
                  pSVar21 = (SPIRType *)((ulong)pSVar21 / 10000);
                  cVar3 = cVar6 + '\x04';
                } while (99999 < uVar24);
                cVar6 = cVar6 + '\x01';
              }
LAB_001c059e:
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar6);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_e8._M_dataplus._M_p,(undefined4)local_e8._M_string_length,uVar7);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            local_88 = (ulong)(pSVar10->parent_type).id;
            pSVar10 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_Compiler).ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + local_88);
          }
        }
        else {
          if (((this->options).flatten_multidimensional_arrays == true) && ((local_bc & 1) == 0)) {
            if (pSVar21 == (SPIRType *)0x1) {
              local_bc = 0;
              local_90 = 0;
            }
            else {
              local_bc = (uint)CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
              uVar13 = ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              local_90 = (uint)CONCAT71((int7)((ulong)uVar13 >> 8),1);
            }
          }
          if ((pSVar10->parent_type).id == 0) {
            __assert_fail("type->parent_type",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                          ,0x1fcd,
                          "string spirv_cross::CompilerGLSL::access_chain_internal(uint32_t, const uint32_t *, uint32_t, AccessChainFlags, AccessChainMeta *)"
                         );
          }
          if (local_70 <
              (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) {
            pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
            pSVar21 = (SPIRType *)(local_70 * 3);
            if ((((pVVar1[local_70].type != TypeVariable) ||
                 (var = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + local_70), uVar28 != 0)) ||
                ((this->backend).force_gl_in_out_block == false)) ||
               ((bVar4 = Compiler::is_builtin_variable(&this->super_Compiler,var), !bVar4 ||
                (bVar4 = Compiler::has_decoration
                                   (&this->super_Compiler,(ID)(pSVar10->super_IVariant).self.id,
                                    DecorationBlock), bVar4)))) goto LAB_001bfd06;
            local_e8._M_dataplus._M_p._0_4_ = local_b8.id;
            pmVar15 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_48,(key_type *)&local_e8);
            if ((pmVar15->decoration).builtin_type < 2) {
              psVar27 = __return_storage_ptr__;
              if (var->storage == StorageClassOutput) {
                to_expression_abi_cxx11_(&local_b0,this,local_f4,(local_c0 & 8) == 0);
                pSVar21 = (SPIRType *)0x2e02be;
                join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          (&local_e8,(spirv_cross *)"gl_out[",(char (*) [8])&local_b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x2e02be,(char (*) [3])__return_storage_ptr__,ts_3);
              }
              else {
                if (var->storage != StorageClassInput) goto LAB_001c036e;
                to_expression_abi_cxx11_(&local_b0,this,local_f4,(local_c0 & 8) == 0);
                pSVar21 = (SPIRType *)0x2e02be;
                join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          (&local_e8,(spirv_cross *)"gl_in[",(char (*) [7])&local_b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x2e02be,(char (*) [3])__return_storage_ptr__,ts_3);
              }
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
            }
            else {
LAB_001c036e:
              uVar24 = local_7c;
              if ((uVar23 & 1) != 0) {
                uVar24 = local_c0;
              }
              psVar27 = (string *)(ulong)uVar24;
              pSVar21 = pSVar10;
              access_chain_internal_append_index
                        (this,__return_storage_ptr__,extraout_EDX_01,pSVar10,uVar24,(bool *)ts_3,
                         local_f4);
            }
          }
          else {
LAB_001bfd06:
            if (((this->options).flatten_multidimensional_arrays == true) && ((local_90 & 1) != 0))
            {
              pSVar14 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (pSVar10->parent_type).id);
              uVar7 = local_f4;
              if ((uVar23 & 1) == 0) {
                pSVar21 = (SPIRType *)0x0;
                to_enclosed_expression_abi_cxx11_(&local_e8,this,local_f4,(local_c0 & 8) == 0);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              }
              else {
                cVar6 = '\x01';
                if (9 < local_f4) {
                  pSVar21 = (SPIRType *)(ulong)local_f4;
                  cVar3 = '\x04';
                  do {
                    cVar6 = cVar3;
                    uVar24 = (uint)pSVar21;
                    if (uVar24 < 100) {
                      cVar6 = cVar6 + -2;
                      goto LAB_001c045e;
                    }
                    if (uVar24 < 1000) {
                      cVar6 = cVar6 + -1;
                      goto LAB_001c045e;
                    }
                    if (uVar24 < 10000) goto LAB_001c045e;
                    pSVar21 = (SPIRType *)((ulong)pSVar21 / 10000);
                    cVar3 = cVar6 + '\x04';
                  } while (99999 < uVar24);
                  cVar6 = cVar6 + '\x01';
                }
LAB_001c045e:
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar6);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_e8._M_dataplus._M_p,(undefined4)local_e8._M_string_length,uVar7);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              sVar17 = (pSVar14->array).super_VectorView<unsigned_int>.buffer_size;
              uVar24 = (uint)sVar17;
              if (uVar24 != 0) {
                do {
                  uVar24 = uVar24 - 1;
                  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                  pSVar21 = (SPIRType *)(ulong)uVar24;
                  pCVar25 = this;
                  to_array_size_abi_cxx11_(&local_b0,this,pSVar14,uVar24);
                  enclose_expression(&local_e8,pCVar25,&local_b0);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p);
                  }
                } while (uVar24 != 0);
                sVar17 = (pSVar14->array).super_VectorView<unsigned_int>.buffer_size;
              }
              if (sVar17 == 0) {
                local_bc = 0;
              }
              else {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                if ((local_bc & 1) != 0) goto LAB_001c0569;
              }
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            else {
              uVar7 = Compiler::get_decoration(&this->super_Compiler,local_b8,DecorationBuiltIn);
              pSVar21 = (SPIRType *)(this->super_Compiler)._vptr_Compiler;
              cVar6 = (**(code **)&pSVar21->type_alias)(this,uVar7);
              if (cVar6 == '\0') {
                uVar24 = local_7c;
                if ((uVar23 & 1) != 0) {
                  uVar24 = local_c0;
                }
                psVar27 = (string *)(ulong)uVar24;
                pSVar21 = pSVar10;
                access_chain_internal_append_index
                          (this,__return_storage_ptr__,extraout_EDX_00,pSVar10,uVar24,(bool *)ts_3,
                           local_f4);
              }
            }
          }
LAB_001c0569:
          local_88 = (ulong)(pSVar10->parent_type).id;
          pSVar10 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + local_88);
          local_c1 = 1;
        }
      }
      else {
        bVar5 = (this->options).flatten_multidimensional_arrays;
        if ((bool)bVar5 == true) {
          if ((pSVar10->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            local_bc = 0;
            local_90 = 0;
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            bVar5 = (this->options).flatten_multidimensional_arrays;
            uVar19 = (undefined7)((ulong)pSVar21 >> 8);
            local_bc = (uint)CONCAT71(uVar19,1);
            pSVar21 = (SPIRType *)CONCAT71(uVar19,1);
            local_90 = (uint)pSVar21;
            uVar20 = extraout_EDX;
          }
        }
        uVar7 = local_f4;
        if (((bVar5 & 1) == 0) || ((local_90 & 1) == 0)) {
          uVar24 = local_7c;
          if ((uVar23 & 1) != 0) {
            uVar24 = local_c0;
          }
          psVar27 = (string *)(ulong)uVar24;
          pSVar21 = pSVar10;
          access_chain_internal_append_index
                    (this,__return_storage_ptr__,uVar20,pSVar10,uVar24,(bool *)ts_3,local_f4);
        }
        else {
          if ((uVar23 & 1) == 0) {
            pSVar21 = (SPIRType *)0x0;
            to_enclosed_expression_abi_cxx11_(&local_e8,this,local_f4,(local_c0 & 8) == 0);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          }
          else {
            cVar6 = '\x01';
            if (9 < local_f4) {
              pSVar21 = (SPIRType *)(ulong)local_f4;
              cVar3 = '\x04';
              do {
                cVar6 = cVar3;
                uVar24 = (uint)pSVar21;
                if (uVar24 < 100) {
                  cVar6 = cVar6 + -2;
                  goto LAB_001c0151;
                }
                if (uVar24 < 1000) {
                  cVar6 = cVar6 + -1;
                  goto LAB_001c0151;
                }
                if (uVar24 < 10000) goto LAB_001c0151;
                pSVar21 = (SPIRType *)((ulong)pSVar21 / 10000);
                cVar3 = cVar6 + '\x04';
              } while (99999 < uVar24);
              cVar6 = cVar6 + '\x01';
            }
LAB_001c0151:
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar6);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_e8._M_dataplus._M_p,(undefined4)local_e8._M_string_length,uVar7);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          sVar17 = (pSVar10->array).super_VectorView<unsigned_int>.buffer_size;
          uVar24 = (uint)sVar17;
          if (uVar24 != 0) {
            do {
              uVar24 = uVar24 - 1;
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              pSVar21 = (SPIRType *)(ulong)uVar24;
              pCVar25 = this;
              to_array_size_abi_cxx11_(&local_b0,this,pSVar10,uVar24);
              enclose_expression(&local_e8,pCVar25,&local_b0);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
            } while (uVar24 != 0);
            sVar17 = (pSVar10->array).super_VectorView<unsigned_int>.buffer_size;
          }
          if (sVar17 == 0) {
            local_bc = 0;
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            if ((local_bc & 1) != 0) goto LAB_001bfa11;
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
LAB_001bfa11:
        local_c1 = 1;
        if (*(int *)&(pSVar10->super_IVariant).field_0xc == 0x15) {
          local_88 = (ulong)(pSVar10->parent_type).id;
          pSVar10 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + local_88);
        }
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != local_40);
    if ((local_bc & 1) != 0) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,
                 "Flattening of multidimensional arrays were enabled, but the access chain was terminated in the middle of a multidimensional array. This is not supported."
                 ,"");
      ::std::runtime_error::runtime_error(prVar18,(string *)&local_e8);
      *(undefined ***)prVar18 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if (meta != (AccessChainMeta *)0x0) {
    meta->need_transpose = (bool)((byte)local_b4 & 1);
    meta->storage_is_packed = local_f5;
    meta->storage_is_invariant = (bool)((byte)local_80 & 1);
    meta->storage_physical_type = local_8c;
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::access_chain_internal(uint32_t base, const uint32_t *indices, uint32_t count,
                                           AccessChainFlags flags, AccessChainMeta *meta)
{
	string expr;

	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool msb_is_id = (flags & ACCESS_CHAIN_LITERAL_MSB_FORCE_ID) != 0;
	bool chain_only = (flags & ACCESS_CHAIN_CHAIN_ONLY_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;
	bool flatten_member_reference = (flags & ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT) != 0;

	if (!chain_only)
	{
		// We handle transpose explicitly, so don't resolve that here.
		auto *e = maybe_get<SPIRExpression>(base);
		bool old_transpose = e && e->need_transpose;
		if (e)
			e->need_transpose = false;
		expr = to_enclosed_expression(base, register_expression_read);
		if (e)
			e->need_transpose = old_transpose;
	}

	// Start traversing type hierarchy at the proper non-pointer types,
	// but keep type_id referencing the original pointer for use below.
	uint32_t type_id = expression_type_id(base);

	if (!backend.native_pointers)
	{
		if (ptr_chain)
			SPIRV_CROSS_THROW("Backend does not support native pointers and does not support OpPtrAccessChain.");

		// Wrapped buffer reference pointer types will need to poke into the internal "value" member before
		// continuing the access chain.
		if (should_dereference(base))
		{
			auto &type = get<SPIRType>(type_id);
			expr = dereference_expression(type, expr);
		}
	}

	const auto *type = &get_pointee_type(type_id);

	bool access_chain_is_arrayed = expr.find_first_of('[') != string::npos;
	bool row_major_matrix_needs_conversion = is_non_native_row_major_matrix(base);
	bool is_packed = has_extended_decoration(base, SPIRVCrossDecorationPhysicalTypePacked);
	uint32_t physical_type = get_extended_decoration(base, SPIRVCrossDecorationPhysicalTypeID);
	bool is_invariant = has_decoration(base, DecorationInvariant);
	bool pending_array_enclose = false;
	bool dimension_flatten = false;

	const auto append_index = [&](uint32_t index, bool is_literal) {
		AccessChainFlags mod_flags = flags;
		if (!is_literal)
			mod_flags &= ~ACCESS_CHAIN_INDEX_IS_LITERAL_BIT;
		access_chain_internal_append_index(expr, base, type, mod_flags, access_chain_is_arrayed, index);
	};

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		bool is_literal = index_is_literal;
		if (is_literal && msb_is_id && (index >> 31u) != 0u)
		{
			is_literal = false;
			index &= 0x7fffffffu;
		}

		// Pointer chains
		if (ptr_chain && i == 0)
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays)
			{
				dimension_flatten = type->array.size() >= 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(type->array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(*type, j - 1));
				}

				if (type->array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			else
			{
				append_index(index, is_literal);
			}

			if (type->basetype == SPIRType::ControlPointArray)
			{
				type_id = type->parent_type;
				type = &get<SPIRType>(type_id);
			}

			access_chain_is_arrayed = true;
		}
		// Arrays
		else if (!type->array.empty())
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays && !pending_array_enclose)
			{
				dimension_flatten = type->array.size() > 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			assert(type->parent_type);

			auto *var = maybe_get<SPIRVariable>(base);
			if (backend.force_gl_in_out_block && i == 0 && var && is_builtin_variable(*var) &&
			    !has_decoration(type->self, DecorationBlock))
			{
				// This deals with scenarios for tesc/geom where arrays of gl_Position[] are declared.
				// Normally, these variables live in blocks when compiled from GLSL,
				// but HLSL seems to just emit straight arrays here.
				// We must pretend this access goes through gl_in/gl_out arrays
				// to be able to access certain builtins as arrays.
				auto builtin = ir.meta[base].decoration.builtin_type;
				switch (builtin)
				{
				// case BuiltInCullDistance: // These are already arrays, need to figure out rules for these in tess/geom.
				// case BuiltInClipDistance:
				case BuiltInPosition:
				case BuiltInPointSize:
					if (var->storage == StorageClassInput)
						expr = join("gl_in[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassOutput)
						expr = join("gl_out[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				default:
					append_index(index, is_literal);
					break;
				}
			}
			else if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				auto &parent_type = get<SPIRType>(type->parent_type);

				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(parent_type.array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(parent_type, j - 1));
				}

				if (parent_type.array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			// Some builtins are arrays in SPIR-V but not in other languages, e.g. gl_SampleMask[] is an array in SPIR-V but not in Metal.
			// By throwing away the index, we imply the index was 0, which it must be for gl_SampleMask.
			else if (!builtin_translates_to_nonarray(BuiltIn(get_decoration(base, DecorationBuiltIn))))
			{
				append_index(index, is_literal);
			}

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);

			access_chain_is_arrayed = true;
		}
		// For structs, the index refers to a constant, which indexes into the members.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			if (!is_literal)
				index = evaluate_constant_u32(index);

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			BuiltIn builtin;
			if (is_member_builtin(*type, index, &builtin))
			{
				if (access_chain_is_arrayed)
				{
					expr += ".";
					expr += builtin_to_glsl(builtin, type->storage);
				}
				else
					expr = builtin_to_glsl(builtin, type->storage);
			}
			else
			{
				// If the member has a qualified name, use it as the entire chain
				string qual_mbr_name = get_member_qualified_name(type_id, index);
				if (!qual_mbr_name.empty())
					expr = qual_mbr_name;
				else if (flatten_member_reference)
					expr += join("_", to_member_name(*type, index));
				else
					expr += to_member_reference(base, *type, index, ptr_chain);
			}

			if (has_member_decoration(type->self, index, DecorationInvariant))
				is_invariant = true;

			is_packed = member_is_packed_physical_type(*type, index);
			if (member_is_remapped_physical_type(*type, index))
				physical_type = get_extended_member_decoration(type->self, index, SPIRVCrossDecorationPhysicalTypeID);
			else
				physical_type = 0;

			row_major_matrix_needs_conversion = member_is_non_native_row_major_matrix(*type, index);
			type = &get<SPIRType>(type->member_types[index]);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			// If we have a row-major matrix here, we need to defer any transpose in case this access chain
			// is used to store a column. We can resolve it right here and now if we access a scalar directly,
			// by flipping indexing order of the matrix.

			expr += "[";
			if (is_literal)
				expr += convert_to_string(index);
			else
				expr += to_expression(index, register_expression_read);
			expr += "]";

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			string deferred_index;
			if (row_major_matrix_needs_conversion)
			{
				// Flip indexing order.
				auto column_index = expr.find_last_of('[');
				if (column_index != string::npos)
				{
					deferred_index = expr.substr(column_index);
					expr.resize(column_index);
				}
			}

			// Internally, access chain implementation can also be used on composites,
			// ignore scalar access workarounds in this case.
			StorageClass effective_storage;
			if (expression_type(base).pointer)
				effective_storage = get_expression_effective_storage_class(base);
			else
				effective_storage = StorageClassGeneric;

			if (!row_major_matrix_needs_conversion)
			{
				// On some backends, we might not be able to safely access individual scalars in a vector.
				// To work around this, we might have to cast the access chain reference to something which can,
				// like a pointer to scalar, which we can then index into.
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			if (is_literal && !is_packed && !row_major_matrix_needs_conversion)
			{
				expr += ".";
				expr += index_to_swizzle(index);
			}
			else if (ir.ids[index].get_type() == TypeConstant && !is_packed && !row_major_matrix_needs_conversion)
			{
				auto &c = get<SPIRConstant>(index);
				if (c.specialization)
				{
					// If the index is a spec constant, we cannot turn extract into a swizzle.
					expr += join("[", to_expression(index), "]");
				}
				else
				{
					expr += ".";
					expr += index_to_swizzle(c.scalar());
				}
			}
			else if (is_literal)
			{
				// For packed vectors, we can only access them as an array, not by swizzle.
				expr += join("[", index, "]");
			}
			else
			{
				expr += "[";
				expr += to_expression(index, register_expression_read);
				expr += "]";
			}

			if (row_major_matrix_needs_conversion)
			{
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			expr += deferred_index;
			row_major_matrix_needs_conversion = false;

			is_packed = false;
			physical_type = 0;
			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		else if (!backend.allow_truncated_access_chain)
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (pending_array_enclose)
	{
		SPIRV_CROSS_THROW("Flattening of multidimensional arrays were enabled, "
		                  "but the access chain was terminated in the middle of a multidimensional array. "
		                  "This is not supported.");
	}

	if (meta)
	{
		meta->need_transpose = row_major_matrix_needs_conversion;
		meta->storage_is_packed = is_packed;
		meta->storage_is_invariant = is_invariant;
		meta->storage_physical_type = physical_type;
	}

	return expr;
}